

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O1

void replay_sync_save(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  sinfo ps;
  jmp_buf old_exit_jmp_buf;
  undefined1 local_e8 [208];
  
  uVar5 = program_state._32_8_;
  uVar4 = program_state._24_8_;
  uVar3 = program_state._16_8_;
  uVar2 = program_state._8_8_;
  uVar1 = program_state._0_8_;
  if (loginfo.out_of_sync != '\0') {
    memcpy(local_e8,exit_jmp_buf,200);
    if ((exit_jmp_buf_valid == 1) && (iVar6 = __sigsetjmp(exit_jmp_buf,1), iVar6 != 0)) {
      raw_printf(
                "The diffs in the recording seem to be invalid.  Replay will use recorded commands instead."
                );
      loginfo.diffs_are_invalid = '\x01';
      freedynamicdata();
    }
    else {
      freedynamicdata();
    }
    program_state.restoring = 1;
    iVar6 = 1;
    if ((flags.tutorial == '\0') && (iVar6 = 3, flags.debug == '\0')) {
      iVar6 = (uint)(flags.explore != '\0') * 2;
    }
    startup_common((char *)0x0,iVar6);
    dorecover(&diff_base);
    iflags.disable_log = '\x01';
    program_state._0_8_ = uVar1;
    program_state._8_8_ = uVar2;
    program_state._16_8_ = uVar3;
    program_state._24_8_ = uVar4;
    program_state._32_8_ = uVar5;
    memcpy(exit_jmp_buf,local_e8,200);
    exit_jmp_buf_valid = 1;
  }
  return;
}

Assistant:

void replay_sync_save(void)
{
    volatile struct sinfo ps;
    jmp_buf old_exit_jmp_buf;

    if (!loginfo.out_of_sync)
	return;

    ps = program_state;

    /* We want to catch exceptions during the load, which means
     * storing the old jmp_buf somewhere. */
    memcpy(&old_exit_jmp_buf, &exit_jmp_buf, sizeof(jmp_buf));
    api_exit();

    /*
     * Use the save created from the diffs, not the one reached by
     * playing through the game with the recorded commands.
     */
    if (!api_entry_checkpoint()) {
	/* ... unless that didn't work. */
	raw_printf("The diffs in the recording seem to be invalid.  "
		   "Replay will use recorded commands instead.");
	loginfo.diffs_are_invalid = TRUE;
	freedynamicdata();
	program_state.restoring = TRUE;
	startup_common(NULL, flags.tutorial ? MODE_TUTORIAL :
			     wizard ? MODE_WIZARD :
			     discover ? MODE_EXPLORE : MODE_NORMAL);
	dorecover(&diff_base);
    } else {
	freedynamicdata();
	program_state.restoring = TRUE;
	startup_common(NULL, flags.tutorial ? MODE_TUTORIAL :
			     wizard ? MODE_WIZARD :
			     discover ? MODE_EXPLORE : MODE_NORMAL);
	dorecover(&diff_base);
    }
    iflags.disable_log = TRUE;
    program_state = ps;

    memcpy(&exit_jmp_buf, &old_exit_jmp_buf, sizeof(jmp_buf));
    exit_jmp_buf_valid = 1;
}